

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O2

void __thiscall Assimp::SMDImporter::ReadSmd(SMDImporter *this,string *pFile,IOSystem *pIOHandler)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  DeadlyImportError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  IOStream *stream;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"rb",(allocator<char> *)&local_50);
  iVar1 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(pFile->_M_dataplus)._M_p,local_70._M_dataplus._M_p);
  stream = (IOStream *)CONCAT44(extraout_var,iVar1);
  std::__cxx11::string::~string((string *)&local_70);
  if (stream != (IOStream *)0x0) {
    uVar2 = (*stream->_vptr_IOStream[6])(stream);
    this->iFileSize = uVar2;
    std::vector<char,_std::allocator<char>_>::resize(&this->mBuffer,(ulong)(uVar2 + 1));
    BaseImporter::TextFileToBuffer(stream,&this->mBuffer,FORBID_EMPTY);
    this->iSmallestFrame = 0x7fffffff;
    this->bHasUVs = true;
    this->iLineNumber = 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&this->aszTextures,10);
    std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::reserve
              (&this->asTriangles,1000);
    std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::reserve(&this->asBones,0x14)
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->aszTextures);
    std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::clear(&this->asTriangles);
    std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::clear(&this->asBones);
    ParseFile(this);
    (*stream->_vptr_IOStream[1])(stream);
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"Failed to open SMD/VTA file ",pFile);
  std::operator+(&local_70,&local_50,".");
  DeadlyImportError::DeadlyImportError(this_00,&local_70);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SMDImporter::ReadSmd(const std::string &pFile, IOSystem* pIOHandler) {
    std::unique_ptr<IOStream> file(pIOHandler->Open(pFile, "rb"));

    // Check whether we can read from the file
    if (file.get() == nullptr) {
        throw DeadlyImportError("Failed to open SMD/VTA file " + pFile + ".");
    }

    iFileSize = (unsigned int)file->FileSize();

    // Allocate storage and copy the contents of the file to a memory buffer
    mBuffer.resize(iFileSize + 1);
    TextFileToBuffer(file.get(), mBuffer);

    iSmallestFrame = INT_MAX;
    bHasUVs = true;
    iLineNumber = 1;

    // Reserve enough space for ... hm ... 10 textures
    aszTextures.reserve(10);

    // Reserve enough space for ... hm ... 1000 triangles
    asTriangles.reserve(1000);

    // Reserve enough space for ... hm ... 20 bones
    asBones.reserve(20);

    aszTextures.clear();
    asTriangles.clear();
    asBones.clear();

    // parse the file ...
    ParseFile();
}